

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_files.cpp
# Opt level: O3

int create_files(int argc,char **argv)

{
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *reqs_begin;
  int *piVar1;
  pointer pcVar2;
  long *plVar3;
  ulong uVar4;
  undefined1 *puVar5;
  undefined8 uVar6;
  bool bVar7;
  void *pvVar8;
  void *pvVar9;
  syscall_file *this;
  ulong *puVar10;
  ostream *poVar11;
  file *pfVar12;
  file *pfVar13;
  long lVar14;
  pointer pbVar15;
  ulong uVar16;
  bool bVar17;
  long lVar18;
  pointer pbVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  undefined1 auVar25 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  disks_arr;
  size_t buffer_size;
  external_size_type length;
  stringstream ss;
  CmdlineParser cp;
  void *local_470;
  undefined1 local_438 [16];
  pointer local_428;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> local_420;
  long local_418;
  undefined1 local_410 [64];
  undefined1 local_3d0 [16];
  size_type local_3c0;
  undefined8 auStack_3b0 [12];
  ios_base local_350 [264];
  undefined1 local_248 [384];
  CmdlineParser local_c8;
  
  local_438 = (undefined1  [16])0x0;
  local_428 = (pointer)0x0;
  tlx::CmdlineParser::CmdlineParser(&local_c8);
  puVar5 = local_3d0 + 0x10;
  local_3d0._0_8_ = puVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_410 + 0x40),"filesize","");
  pcVar2 = local_248 + 0x10;
  local_248._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,"Number of bytes to write to files.","");
  tlx::CmdlineParser::add_param_bytes
            (&local_c8,(string *)(local_410 + 0x40),(uint64_t *)(local_410 + 0x18),
             (string *)local_248);
  if ((pointer)local_248._0_8_ != pcVar2) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((undefined1 *)local_3d0._0_8_ != puVar5) {
    operator_delete((void *)local_3d0._0_8_,local_3c0 + 1);
  }
  local_3d0._0_8_ = puVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_410 + 0x40),"filename","");
  local_248._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"Paths to files to write.","")
  ;
  tlx::CmdlineParser::add_param_stringlist
            (&local_c8,(string *)(local_410 + 0x40),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_438,(string *)local_248);
  if ((pointer)local_248._0_8_ != pcVar2) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((undefined1 *)local_3d0._0_8_ != puVar5) {
    operator_delete((void *)local_3d0._0_8_,local_3c0 + 1);
  }
  bVar7 = tlx::CmdlineParser::process(&local_c8,argc,argv);
  uVar6 = local_410._24_8_;
  iVar21 = -1;
  if (bVar7) {
    if (local_438._8_8_ == local_438._0_8_) {
      pfVar12 = (file *)0x0;
      lVar18 = 0;
      pbVar15 = (pointer)local_438._8_8_;
      pbVar19 = (pointer)local_438._0_8_;
    }
    else {
      lVar14 = 0;
      poVar11 = (ostream *)(local_410 + 0x40);
      pfVar13 = (file *)0x0;
      do {
        unlink(*(char **)((long)&(((pointer)local_438._0_8_)->_M_dataplus)._M_p + lVar14));
        tlx::Logger::Logger((Logger *)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"# Add disk: ",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,*(char **)((long)&((_Alloc_hider *)local_438._0_8_)->_M_p + lVar14),
                   *(long *)((long)(local_438._0_8_ + 8) + lVar14));
        tlx::Logger::~Logger((Logger *)poVar11);
        pfVar13 = (file *)((long)&pfVar13->_vptr_file + 1);
        lVar18 = local_438._8_8_ - local_438._0_8_;
        pfVar12 = (file *)(lVar18 >> 5);
        lVar14 = lVar14 + 0x20;
        pbVar15 = (pointer)local_438._8_8_;
        pbVar19 = (pointer)local_438._0_8_;
      } while (pfVar13 < pfVar12);
    }
    local_410._16_8_ = (Caller)0x10000000;
    pvVar8 = foxxll::aligned_alloc<4096ul>(lVar18 << 0x17,0);
    pvVar9 = operator_new__(-(ulong)((ulong)pfVar12 >> 0x3d != 0) | lVar18 >> 2);
    uVar20 = lVar18 >> 4;
    uVar16 = 0xffffffffffffffff;
    if (uVar20 < 0x2000000000000000) {
      uVar16 = lVar18 >> 1 | 8;
    }
    local_410._32_8_ = operator_new__(uVar16);
    *(ulong *)local_410._32_8_ = uVar20;
    reqs_begin = (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)
                 (local_410._32_8_ + 8);
    if (pbVar15 != pbVar19) {
      memset(reqs_begin,0,lVar18 >> 1 & 0xfffffffffffffff8);
    }
    if (lVar18 * 0x200000 != 0) {
      iVar21 = 0;
      iVar22 = 1;
      iVar23 = 2;
      iVar24 = 3;
      lVar14 = 0;
      do {
        piVar1 = (int *)((long)pvVar8 + lVar14 * 4);
        *piVar1 = iVar21;
        piVar1[1] = iVar22;
        piVar1[2] = iVar23;
        piVar1[3] = iVar24;
        lVar14 = lVar14 + 4;
        iVar21 = iVar21 + 4;
        iVar22 = iVar22 + 4;
        iVar23 = iVar23 + 4;
        iVar24 = iVar24 + 4;
      } while (lVar18 * 0x200000 != lVar14);
    }
    if (pfVar12 != (file *)0x0) {
      lVar18 = 0;
      pfVar13 = (file *)0x0;
      do {
        this = (syscall_file *)operator_new(0x98);
        foxxll::syscall_file::syscall_file
                  (this,(string *)((long)&((_Alloc_hider *)local_438._0_8_)->_M_p + lVar18),0x1c,
                   (int)pfVar13,-1,0xffffffff,(file_stats *)0x0);
        *(undefined1 **)((long)pvVar9 + (long)pfVar13 * 8) = &(this->super_ufs_file_base).field_0x70
        ;
        pfVar13 = (file *)((long)&pfVar13->_vptr_file + 1);
        lVar18 = lVar18 + 0x20;
      } while (pfVar12 != pfVar13);
    }
    if ((void *)uVar6 != (void *)0x0) {
      local_410._40_8_ = reqs_begin + uVar20;
      local_470 = (void *)0x0;
      do {
        std::__cxx11::stringstream::stringstream((stringstream *)(local_410 + 0x40));
        puVar10 = (ulong *)(local_410 + 0x10);
        if ((void *)local_410._24_8_ != (void *)0x0) {
          local_248._0_8_ = (pointer)(uVar6 - (long)local_470);
          if ((pointer)(uVar6 - (long)local_470) < (pointer)0x10000000) {
            puVar10 = (ulong *)local_248;
          }
        }
        uVar16 = *puVar10;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_3d0 + 0x10),"Disk offset ",0xc);
        *(undefined8 *)((long)auStack_3b0 + *(long *)(local_3c0 - 0x18)) = 7;
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)(local_3d0 + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," MiB: ",6);
        *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
             *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xfffffefb | 4;
        lVar18 = std::chrono::_V2::steady_clock::now();
        local_410._48_8_ = (double)(lVar18 / 1000) / 1000000.0;
        if (pfVar12 != (file *)0x0) {
          pfVar13 = (file *)0x0;
          do {
            plVar3 = *(long **)((long)pvVar9 + (long)pfVar13 * 8);
            lVar18 = 0;
            bVar7 = true;
            local_410._56_8_ = pfVar13;
            do {
              bVar17 = bVar7;
              local_248._16_8_ = 0;
              local_248._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_248._0_8_ = (pointer)0x0;
              local_248._8_8_ = 0;
              (**(code **)(*plVar3 + 8))
                        (&local_420,plVar3,
                         (long)pvVar8 + lVar18 * 0x8000000 + (long)pfVar13 * 0x10000000,
                         (void *)(lVar18 * (uVar16 >> 1) + (long)local_470),uVar16 >> 1,local_248);
              if (reqs_begin[(long)pfVar13 * 2 + lVar18].ptr_ != local_420.ptr_) {
                tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                          (reqs_begin + (long)pfVar13 * 2 + lVar18);
                reqs_begin[(long)pfVar13 * 2 + lVar18].ptr_ = local_420.ptr_;
                local_420.ptr_ = (request *)0x0;
              }
              tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                        (&local_420);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._24_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._24_8_);
              }
              lVar18 = 1;
              bVar7 = false;
            } while (bVar17);
            pfVar13 = (file *)((long)(_func_int ***)local_410._56_8_ + 1);
          } while (pfVar13 != pfVar12);
        }
        foxxll::wait_all<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>*>
                  (reqs_begin,
                   (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_410._40_8_)
        ;
        lVar18 = std::chrono::_V2::steady_clock::now();
        *(undefined8 *)((long)auStack_3b0 + *(long *)(local_3c0 - 0x18)) = 7;
        auVar25._0_8_ = (double)CONCAT44(0x43300000,(int)uVar16);
        auVar25._8_4_ = (int)(uVar16 >> 0x20);
        auVar25._12_4_ = 0x45300000;
        poVar11 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)(local_3d0 + 0x10),
                             (int)((((auVar25._8_8_ - 1.9342813113834067e+25) +
                                    (auVar25._0_8_ - 4503599627370496.0)) * 9.5367431640625e-07) /
                                  ((double)(lVar18 / 1000) / 1000000.0 - (double)local_410._48_8_)))
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," MiB/s,",7);
        tlx::Logger::Logger((Logger *)local_248);
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_248,(char *)local_420.ptr_,local_418);
        if (local_420.ptr_ != (request *)local_410) {
          operator_delete(local_420.ptr_,local_410._0_8_ + 1);
        }
        tlx::Logger::~Logger((Logger *)local_248);
        local_470 = (void *)((long)local_470 + uVar16);
        std::__cxx11::stringstream::~stringstream((stringstream *)(local_410 + 0x40));
        std::ios_base::~ios_base(local_350);
      } while (local_470 < (ulong)uVar6);
    }
    uVar6 = local_410._32_8_;
    uVar16 = *(ulong *)local_410._32_8_ * 8;
    uVar20 = uVar16;
    uVar4 = *(ulong *)local_410._32_8_;
    while (uVar4 != 0) {
      tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)(uVar6 + uVar20));
      uVar20 = uVar20 - 8;
      uVar4 = uVar20;
    }
    operator_delete__((void *)uVar6,uVar16 + 8);
    if (pfVar12 != (file *)0x0) {
      pfVar13 = (file *)0x0;
      do {
        plVar3 = *(long **)((long)pvVar9 + (long)pfVar13 * 8);
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 0x60))();
        }
        pfVar13 = (file *)((long)&pfVar13->_vptr_file + 1);
      } while (pfVar12 != pfVar13);
    }
    operator_delete__(pvVar9);
    if (pvVar8 != (void *)0x0) {
      free(*(void **)((long)pvVar8 + -8));
    }
    iVar21 = 0;
  }
  tlx::CmdlineParser::~CmdlineParser(&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_438);
  return iVar21;
}

Assistant:

int create_files(int argc, char* argv[])
{
    std::vector<std::string> disks_arr;
    external_size_type offset = 0, length;

    tlx::CmdlineParser cp;
    cp.add_param_bytes(
        "filesize", length,
        "Number of bytes to write to files."
    );
    cp.add_param_stringlist(
        "filename", disks_arr,
        "Paths to files to write."
    );

    if (!cp.process(argc, argv))
        return -1;

    external_size_type endpos = offset + length;

    for (size_t i = 0; i < disks_arr.size(); ++i)
    {
        unlink(disks_arr[i].c_str());
        LOG1 << "# Add disk: " << disks_arr[i];
    }

    const size_t ndisks = disks_arr.size();

#if FOXXLL_WINDOWS
    size_t buffer_size = 64 * MB;
#else
    size_t buffer_size = 256 * MB;
#endif
    const size_t buffer_size_int = buffer_size / sizeof(int);

    unsigned chunks = 2;
    const size_t chunk_size = buffer_size / chunks;
    const size_t chunk_size_int = chunk_size / sizeof(int);

    size_t i = 0, j = 0;

    auto* buffer = static_cast<int*>(foxxll::aligned_alloc<BLOCK_ALIGN>(buffer_size * ndisks));
    file** disks = new file*[ndisks];
    request_ptr* reqs = new request_ptr[ndisks * chunks];
#ifdef WATCH_TIMES
    double* r_finish_times = new double[ndisks];
    double* w_finish_times = new double[ndisks];
#endif

    for (i = 0; i < ndisks * buffer_size_int; i++)
        buffer[i] = static_cast<int>(i);

    for (i = 0; i < ndisks; i++)
    {
#if FOXXLL_WINDOWS
 #ifdef RAW_ACCESS
        disks[i] = new foxxll::wincall_file(
                disks_arr[i],
                file::CREAT | file::RDWR | file::DIRECT, static_cast<int>(i)
            );
 #else
        disks[i] = new foxxll::wincall_file(
                disks_arr[i],
                file::CREAT | file::RDWR, static_cast<int>(i)
            );
 #endif
#else
 #ifdef RAW_ACCESS
        disks[i] = new foxxll::syscall_file(
                disks_arr[i],
                file::CREAT | file::RDWR | file::DIRECT, static_cast<int>(i)
            );
 #else
        disks[i] = new foxxll::syscall_file(
                disks_arr[i],
                file::CREAT | file::RDWR, static_cast<int>(i)
            );
 #endif
#endif
    }

    while (offset < endpos)
    {
        std::stringstream ss;

        const size_t current_block_size =
            length
            ? static_cast<size_t>(std::min<external_size_type>(buffer_size, endpos - offset))
            : buffer_size;

        const size_t current_chunk_size = current_block_size / chunks;

        ss << "Disk offset " << std::setw(7) << offset / MB << " MiB: " << std::fixed;

        double begin = timestamp(), end;

#ifndef DO_ONLY_READ
        for (i = 0; i < ndisks; i++)
        {
            for (j = 0; j < chunks; j++)
                reqs[i * chunks + j] =
                    disks[i]->awrite(
                        buffer + buffer_size_int * i + j * chunk_size_int,
                        offset + j * current_chunk_size,
                        current_chunk_size
                    );
        }

 #ifdef WATCH_TIMES
        watch_times(reqs, ndisks, w_finish_times);
 #else
        wait_all(reqs, ndisks * chunks);
 #endif

        end = timestamp();

 #ifdef WATCH_TIMES
        out_stat(begin, end, w_finish_times, ndisks, disks_arr);
 #endif
        ss << std::setw(7) << int(double(current_block_size) / MB / (end - begin)) << " MiB/s,";
#endif

#ifndef NOREAD
        begin = timestamp();

        for (i = 0; i < ndisks; i++)
        {
            for (j = 0; j < chunks; j++)
                reqs[i * chunks + j] = disks[i]->aread(
                        buffer + buffer_size_int * i + j * chunk_size_int,
                        offset + j * current_chunk_size,
                        current_chunk_size
                    );
        }

 #ifdef WATCH_TIMES
        watch_times(reqs, ndisks, r_finish_times);
 #else
        wait_all(reqs, ndisks * chunks);
 #endif

        end = timestamp();

        ss << int(double(current_block_size) / MB / (end - begin)) << " MiB/s";
        ss.str();

#ifdef WATCH_TIMES
        out_stat(begin, end, r_finish_times, ndisks, disks_arr);
#endif

        if (CHECK_AFTER_READ) {
            for (size_t i = 0; i < ndisks * buffer_size_int; i++)
            {
                if (buffer[i] != static_cast<int>(i))
                {
                    size_t ibuf = i / buffer_size_int;
                    size_t pos = i % buffer_size_int;

                    LOG1 << "Error on disk " << ibuf << " position " << std::hex << std::setw(8) << offset + pos * sizeof(int)
                         << "  got: " << std::hex << std::setw(8) << buffer[i] << " wanted: " << std::hex << std::setw(8) << static_cast<int>(i)
                         << std::dec;

                    i = (ibuf + 1) * buffer_size_int; // jump to next
                }
            }
        }
#else
        LOG1 << ss.str();
#endif

        offset += current_block_size;
    }

#ifdef WATCH_TIMES
    delete[] r_finish_times;
    delete[] w_finish_times;
#endif
    delete[] reqs;
    for (i = 0; i < ndisks; i++)
        delete disks[i];
    delete[] disks;
    foxxll::aligned_dealloc<BLOCK_ALIGN>(buffer);

    return 0;
}